

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildTestDyndepBuildDiscoverNowWantEdgeAndDependent::Run
          (BuildTestDyndepBuildDiscoverNowWantEdgeAndDependent *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  size_type sVar6;
  reference pvVar7;
  allocator<char> local_161;
  string local_160;
  undefined1 local_140 [8];
  string err;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  BuildTestDyndepBuildDiscoverNowWantEdgeAndDependent *pBStack_10;
  int fail_count;
  BuildTestDyndepBuildDiscoverNowWantEdgeAndDependent *this_local;
  
  pBStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule touch\n  command = touch $out $out.imp\nrule cp\n  command = cp $in $out\nbuild dd: cp dd-in\nbuild tmp: touch || dd\n  dyndep = dd\nbuild out: touch tmp\n"
              ,local_1c);
  iVar2 = local_14;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"tmp",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_40,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"out",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_a0,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"dd-in",&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"ninja_dyndep_version = 1\nbuild tmp | tmp.imp: dyndep\n",
               (allocator<char> *)(err.field_2._M_local_buf + 0xf));
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_f0,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::__cxx11::string::string((string *)local_140);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"out",&local_161);
    pNVar5 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_160,(string *)local_140);
    testing::Test::Check
              (pTVar1,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xd6b,"builder_.AddTarget(\"out\", &err)");
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    pTVar1 = g_current_test;
    bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_140);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0xd6c,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar3) {
      bVar3 = Builder::Build(&(this->super_BuildTest).builder_,(string *)local_140);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0xd6d,"builder_.Build(&err)");
      pTVar1 = g_current_test;
      bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_140);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0xd6e,"\"\" == err");
      pTVar1 = g_current_test;
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->super_BuildTest).command_runner_.commands_ran_);
      bVar3 = testing::Test::Check
                        (pTVar1,sVar6 == 3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0xd6f,"3u == command_runner_.commands_ran_.size()");
      pTVar1 = g_current_test;
      if (bVar3) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&(this->super_BuildTest).command_runner_.commands_ran_,0);
        bVar3 = std::operator==("cp dd-in dd",pvVar7);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0xd70,"\"cp dd-in dd\" == command_runner_.commands_ran_[0]");
        pTVar1 = g_current_test;
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&(this->super_BuildTest).command_runner_.commands_ran_,1);
        bVar3 = std::operator==("touch tmp tmp.imp",pvVar7);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0xd71,"\"touch tmp tmp.imp\" == command_runner_.commands_ran_[1]");
        pTVar1 = g_current_test;
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&(this->super_BuildTest).command_runner_.commands_ran_,2);
        bVar3 = std::operator==("touch out out.imp",pvVar7);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0xd72,"\"touch out out.imp\" == command_runner_.commands_ran_[2]");
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
    std::__cxx11::string::~string((string *)local_140);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(BuildTest, DyndepBuildDiscoverNowWantEdgeAndDependent) {
  // Verify that a dyndep file can be built and loaded to discover
  // that an edge and a dependent are actually wanted.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out $out.imp\n"
"rule cp\n"
"  command = cp $in $out\n"
"build dd: cp dd-in\n"
"build tmp: touch || dd\n"
"  dyndep = dd\n"
"build out: touch tmp\n"
));
  fs_.Create("tmp", "");
  fs_.Create("out", "");
  fs_.Create("dd-in",
"ninja_dyndep_version = 1\n"
"build tmp | tmp.imp: dyndep\n"
);

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);
  ASSERT_EQ(3u, command_runner_.commands_ran_.size());
  EXPECT_EQ("cp dd-in dd", command_runner_.commands_ran_[0]);
  EXPECT_EQ("touch tmp tmp.imp", command_runner_.commands_ran_[1]);
  EXPECT_EQ("touch out out.imp", command_runner_.commands_ran_[2]);
}